

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O0

void __thiscall
cmCPackIFWInstaller::printSkippedOptionWarning
          (cmCPackIFWInstaller *this,string *optionName,string *optionValue)

{
  cmCPackLog *this_00;
  ostream *poVar1;
  char *msg;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream cmCPackLog_msg;
  string *optionValue_local;
  string *optionName_local;
  cmCPackIFWInstaller *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"Option ");
  poVar1 = std::operator<<(poVar1,(string *)optionName);
  poVar1 = std::operator<<(poVar1," contains the value \"");
  poVar1 = std::operator<<(poVar1,(string *)optionValue);
  poVar1 = std::operator<<(poVar1,
                           "\" but will be skipped because the specified file does not exist.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
    this_00 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(this_00,8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWInstaller.cxx"
                    ,0x1f,msg);
    std::__cxx11::string::~string(local_1c8);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void cmCPackIFWInstaller::printSkippedOptionWarning(
  const std::string& optionName, const std::string& optionValue)
{
  cmCPackIFWLogger(
    WARNING,
    "Option "
      << optionName << " contains the value \"" << optionValue
      << "\" but will be skipped because the specified file does not exist."
      << std::endl);
}